

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.cpp
# Opt level: O0

void __thiscall TasGrid::GridFourier::write<false>(GridFourier *this,ostream *os)

{
  bool bVar1;
  int iVar2;
  ostream *os_local;
  GridFourier *this_local;
  
  ::std::ostream::operator<<(os,::std::scientific);
  ::std::ios_base::precision((ios_base *)(os + *(long *)(*(long *)os + -0x18)),0x11);
  IO::writeNumbers<false,(TasGrid::IO::IOPad)3,int,int>
            (os,(this->super_BaseCanonicalGrid).num_dimensions,
             (this->super_BaseCanonicalGrid).num_outputs);
  MultiIndexSet::write<false>(&this->tensors,os);
  MultiIndexSet::write<false>(&this->active_tensors,os);
  bVar1 = ::std::vector<int,_std::allocator<int>_>::empty(&this->active_w);
  if (!bVar1) {
    IO::writeVector<false,(TasGrid::IO::IOPad)3,int>(&this->active_w,os);
  }
  bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
  IO::writeFlag<false,(TasGrid::IO::IOPad)4>((bool)((bVar1 ^ 0xffU) & 1),os);
  bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
  if (!bVar1) {
    MultiIndexSet::write<false>(&(this->super_BaseCanonicalGrid).points,os);
  }
  bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).needed);
  IO::writeFlag<false,(TasGrid::IO::IOPad)4>((bool)((bVar1 ^ 0xffU) & 1),os);
  bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).needed);
  if (!bVar1) {
    MultiIndexSet::write<false>(&(this->super_BaseCanonicalGrid).needed,os);
  }
  IO::writeVector<false,(TasGrid::IO::IOPad)3,int>(&this->max_levels,os);
  if (0 < (this->super_BaseCanonicalGrid).num_outputs) {
    StorageSet::write<false>(&(this->super_BaseCanonicalGrid).values,os);
    iVar2 = Data2D<double>::getNumStrips(&this->fourier_coefs);
    IO::writeFlag<false,(TasGrid::IO::IOPad)4>(iVar2 != 0,os);
    bVar1 = Data2D<double>::empty(&this->fourier_coefs);
    if (!bVar1) {
      Data2D<double>::writeVector<false,(TasGrid::IO::IOPad)3>(&this->fourier_coefs,os);
    }
  }
  bVar1 = MultiIndexSet::empty(&this->updated_tensors);
  IO::writeFlag<false,(TasGrid::IO::IOPad)3>((bool)((bVar1 ^ 0xffU) & 1),os);
  bVar1 = MultiIndexSet::empty(&this->updated_tensors);
  if (!bVar1) {
    MultiIndexSet::write<false>(&this->updated_tensors,os);
    MultiIndexSet::write<false>(&this->updated_active_tensors,os);
    IO::writeVector<false,(TasGrid::IO::IOPad)3,int>(&this->updated_active_w,os);
  }
  return;
}

Assistant:

void GridFourier::write(std::ostream &os) const{
    if (iomode == mode_ascii){ os << std::scientific; os.precision(17); }
    IO::writeNumbers<iomode, IO::pad_line>(os, num_dimensions, num_outputs);

    tensors.write<iomode>(os);
    active_tensors.write<iomode>(os);
    if (!active_w.empty())
        IO::writeVector<iomode, IO::pad_line>(active_w, os);

    IO::writeFlag<iomode, IO::pad_auto>(!points.empty(), os);
    if (!points.empty()) points.write<iomode>(os);
    IO::writeFlag<iomode, IO::pad_auto>(!needed.empty(), os);
    if (!needed.empty()) needed.write<iomode>(os);

    IO::writeVector<iomode, IO::pad_line>(max_levels, os);

    if (num_outputs > 0){
        values.write<iomode>(os);
        IO::writeFlag<iomode, IO::pad_auto>((fourier_coefs.getNumStrips() != 0), os);
        if (!fourier_coefs.empty()) fourier_coefs.writeVector<iomode, IO::pad_line>(os);
    }

    IO::writeFlag<iomode, IO::pad_line>(!updated_tensors.empty(), os);
    if (!updated_tensors.empty()){
        updated_tensors.write<iomode>(os);
        updated_active_tensors.write<iomode>(os);
        IO::writeVector<iomode, IO::pad_line>(updated_active_w, os);
    }
}